

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

int recff_bit64_shift(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  CTState *cts;
  TRef TVar2;
  uint uVar3;
  CTypeID k;
  TRef TVar4;
  int iVar5;
  
  cts = *(CTState **)&J[-1].penalty[0x3c].val;
  iVar5 = 0;
  TVar2 = 0;
  if ((*J->base != 0) && (uVar3 = J->base[1], (uVar3 & 0x1f000000) == 0xa000000)) {
    TVar2 = crec_ct_tv(J,cts->tab + 0xb,0,uVar3,rd->argv + 1);
    uVar3 = TVar2 >> 0x18 & 0x1f;
    if (4 < uVar3 - 0xf) {
      (J->fold).ins.field_0.ot = 0x5b13;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (ushort)uVar3 | 0x260;
      TVar2 = lj_opt_fold(J);
    }
    J->base[1] = TVar2;
  }
  k = crec_bit64_type(cts,rd->argv);
  if (k != 0) {
    TVar4 = crec_ct_tv(J,cts->tab + k,0,*J->base,rd->argv);
    uVar1 = rd->data;
    if (TVar2 == 0) {
      TVar2 = lj_opt_narrow_tobit(J,J->base[1]);
    }
    (J->fold).ins.field_0.ot = (short)(uVar1 << 8) + (short)k + 10;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold(J);
    TVar4 = lj_ir_kint(J,k);
    (J->fold).ins.field_0.ot = 0x548a;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    TVar2 = lj_opt_fold(J);
    *J->base = TVar2;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

int LJ_FASTCALL recff_bit64_shift(jit_State *J, RecordFFData *rd)
{
  CTState *cts = ctype_ctsG(J2G(J));
  CTypeID id;
  TRef tsh = 0;
  if (J->base[0] && tref_iscdata(J->base[1])) {
    tsh = crec_ct_tv(J, ctype_get(cts, CTID_INT64), 0,
		     J->base[1], &rd->argv[1]);
    if (!tref_isinteger(tsh))
      tsh = emitconv(tsh, IRT_INT, tref_type(tsh), 0);
    J->base[1] = tsh;
  }
  id = crec_bit64_type(cts, &rd->argv[0]);
  if (id) {
    TRef tr = crec_ct_tv(J, ctype_get(cts, id), 0, J->base[0], &rd->argv[0]);
    uint32_t op = rd->data;
    if (!tsh) tsh = lj_opt_narrow_tobit(J, J->base[1]);
    if (!(op < IR_BROL ? LJ_TARGET_MASKSHIFT : LJ_TARGET_MASKROT) &&
	!tref_isk(tsh))
      tsh = emitir(IRTI(IR_BAND), tsh, lj_ir_kint(J, 63));
#ifdef LJ_TARGET_UNIFYROT
      if (op == (LJ_TARGET_UNIFYROT == 1 ? IR_BROR : IR_BROL)) {
	op = LJ_TARGET_UNIFYROT == 1 ? IR_BROL : IR_BROR;
	tsh = emitir(IRTI(IR_NEG), tsh, tsh);
      }
#endif
    tr = emitir(IRT(op, id-CTID_INT64+IRT_I64), tr, tsh);
    J->base[0] = emitir(IRTG(IR_CNEWI, IRT_CDATA), lj_ir_kint(J, id), tr);
    return 1;
  }
  return 0;
}